

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

void __thiscall TPZFMatrix<long_double>::~TPZFMatrix(TPZFMatrix<long_double> *this,void **vtt)

{
  longdouble *plVar1;
  
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)*vtt;
  plVar1 = this->fElem;
  if ((plVar1 != (longdouble *)0x0) && (plVar1 != this->fGiven)) {
    operator_delete__(plVar1);
  }
  this->fElem = (longdouble *)0x0;
  this->fSize = 0;
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  plVar1 = (this->fWork).fStore;
  if (plVar1 != (longdouble *)0x0) {
    operator_delete__(plVar1);
  }
  TPZManVector<int,_5>::~TPZManVector(&this->fPivot);
  return;
}

Assistant:

TPZFMatrix<TVar>::~TPZFMatrix() {
    if(fElem && fElem != fGiven) delete[]( fElem );
    fElem = 0;
    fSize = 0;
}